

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

size_t __thiscall
edition_unittest::TestLazyMessageRepeated::ByteSizeLong(TestLazyMessageRepeated *this)

{
  bool bVar1;
  int iVar2;
  RepeatedPtrField<edition_unittest::TestLazyMessage> *this_00;
  reference value;
  size_t sVar3;
  TestLazyMessage *msg;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<edition_unittest::TestLazyMessage> *__range2;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  TestLazyMessageRepeated *this_;
  TestLazyMessageRepeated *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  iVar2 = _internal_repeated_message_size(this);
  sStack_58 = (size_t)iVar2;
  this_00 = _internal_repeated_message(this);
  __end2 = google::protobuf::RepeatedPtrField<edition_unittest::TestLazyMessage>::begin(this_00);
  msg = (TestLazyMessage *)
        google::protobuf::RepeatedPtrField<edition_unittest::TestLazyMessage>::end(this_00);
  while( true ) {
    bVar1 = google::protobuf::internal::operator!=(&__end2,(iterator *)&msg);
    if (!bVar1) break;
    value = google::protobuf::internal::RepeatedPtrIterator<const_edition_unittest::TestLazyMessage>
            ::operator*(&__end2);
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSize<edition_unittest::TestLazyMessage>(value);
    sStack_58 = sVar3 + sStack_58;
    google::protobuf::internal::RepeatedPtrIterator<const_edition_unittest::TestLazyMessage>::
    operator++(&__end2);
  }
  sVar3 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_58,&(this->field_0)._impl_._cached_size_);
  return sVar3;
}

Assistant:

::size_t TestLazyMessageRepeated::ByteSizeLong() const {
  const TestLazyMessageRepeated& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:edition_unittest.TestLazyMessageRepeated)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .edition_unittest.TestLazyMessage repeated_message = 1;
    {
      total_size += 1UL * this_._internal_repeated_message_size();
      for (const auto& msg : this_._internal_repeated_message()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}